

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# svgtextelement.cpp
# Opt level: O1

void __thiscall
lunasvg::SVGTextFragmentsBuilder::handleText(SVGTextFragmentsBuilder *this,SVGTextNode *node)

{
  SVGElement *pSVar1;
  _Bool _Var2;
  int iVar3;
  char32_t cVar4;
  char32_t __c;
  char32_t cVar5;
  size_type startOffset;
  plutovg_text_iterator_t it;
  size_type local_60;
  SVGTextNode *local_58;
  ulong local_50;
  plutovg_text_iterator_t local_48;
  
  if ((node->m_data)._M_string_length != 0) {
    pSVar1 = (node->super_SVGNode).m_parentElement;
    local_58 = node;
    if ((pSVar1 == (SVGElement *)0x0) ||
       (iVar3 = (*(pSVar1->super_SVGNode)._vptr_SVGNode[7])(pSVar1), (char)iVar3 == '\0')) {
      __assert_fail("node && node->isTextPositioningElement()",
                    "/workspace/llm4binary/github/license_c_cmakelists/sammycage[P]lunasvg/source/svgtextelement.cpp"
                    ,0x11,
                    "const SVGTextPositioningElement *lunasvg::toSVGTextPositioningElement(const SVGNode *)"
                   );
    }
    local_60 = this->m_text->_M_string_length;
    if (local_60 == 0) {
      cVar5 = L' ';
    }
    else {
      cVar5 = (this->m_text->_M_dataplus)._M_p[local_60 - 1];
    }
    plutovg_text_iterator_init
              (&local_48,(node->m_data)._M_dataplus._M_p,(int)(node->m_data)._M_string_length,
               PLUTOVG_TEXT_ENCODING_UTF8);
    _Var2 = plutovg_text_iterator_has_next(&local_48);
    if (_Var2) {
      do {
        cVar4 = plutovg_text_iterator_next(&local_48);
        __c = cVar4;
        if ((uint)(cVar4 + L'\xfffffff7') < 2) {
          __c = L' ';
        }
        if (cVar4 == L'\r') {
          __c = L' ';
        }
        if (((__c == L' ') && (cVar5 == L' ')) &&
           (*(char *)((long)&pSVar1[4].super_SVGNode._vptr_SVGNode + 3) == '\0')) {
          cVar5 = L' ';
        }
        else {
          std::__cxx11::
          basic_string<char32_t,_std::char_traits<char32_t>,_std::allocator<char32_t>_>::push_back
                    (this->m_text,__c);
          cVar5 = __c;
        }
        _Var2 = plutovg_text_iterator_has_next(&local_48);
      } while (_Var2);
    }
    local_50 = this->m_text->_M_string_length;
    if (local_60 < local_50) {
      std::vector<lunasvg::SVGTextPosition,std::allocator<lunasvg::SVGTextPosition>>::
      emplace_back<lunasvg::SVGTextNode_const*&,unsigned_long_const&,unsigned_long>
                ((vector<lunasvg::SVGTextPosition,std::allocator<lunasvg::SVGTextPosition>> *)
                 &this->m_textPositions,&local_58,&local_60,&local_50);
    }
  }
  return;
}

Assistant:

void SVGTextFragmentsBuilder::handleText(const SVGTextNode* node)
{
    const auto& text = node->data();
    if(text.empty())
        return;
    auto element = toSVGTextPositioningElement(node->parentElement());
    const auto startOffset = m_text.length();
    uint32_t lastCharacter = ' ';
    if(!m_text.empty()) {
        lastCharacter = m_text.back();
    }

    plutovg_text_iterator_t it;
    plutovg_text_iterator_init(&it, text.data(), text.length(), PLUTOVG_TEXT_ENCODING_UTF8);
    while(plutovg_text_iterator_has_next(&it)) {
        auto currentCharacter = plutovg_text_iterator_next(&it);
        if(currentCharacter == '\t' || currentCharacter == '\n' || currentCharacter == '\r')
            currentCharacter = ' ';
        if(currentCharacter == ' ' && lastCharacter == ' ' && element->white_space() == WhiteSpace::Default)
            continue;
        m_text.push_back(currentCharacter);
        lastCharacter = currentCharacter;
    }

    if(startOffset < m_text.length()) {
        m_textPositions.emplace_back(node, startOffset, m_text.length());
    }
}